

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

long passthrough_resampler_fill_short_input
               (cubeb_stream *stream,void *user_ptr,void *input_buffer,void *output_buffer,
               long nframes)

{
  long in_R8;
  anon_class_16_2_bcd3ee38 *in_stack_00000050;
  
  passthrough_resampler_fill_short_input::anon_class_16_2_bcd3ee38::operator()(in_stack_00000050);
  return in_R8;
}

Assistant:

static long
passthrough_resampler_fill_short_input(cubeb_stream * stream,
                                       void * user_ptr,
                                       void const * input_buffer,
                                       void * output_buffer,
                                       long nframes) {
  // gtest does not support using ASSERT_EQ and friends in a
  // function that returns a value.
  [nframes, input_buffer]() {
    ASSERT_EQ(nframes, 32);
    const float* input = static_cast<const float*>(input_buffer);
    // First part contains the input
    for (int i = 0; i < 32; ++i) {
      ASSERT_FLOAT_EQ(input[i], 0.01 * i);
    }
    // missing part contains silence
    for (int i = 32; i < 64; ++i) {
      ASSERT_FLOAT_EQ(input[i], 0.0);
    }
  }();
  return nframes;
}